

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int StateGetHandSize(pyhanabi_state_t *state,int pid)

{
  const_reference this;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *this_00
  ;
  size_type sVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  size_type in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI != (undefined8 *)0x0) {
    hanabi_learning_env::HanabiState::Hands((HanabiState *)*in_RDI);
    this = std::
           vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
           ::at((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    this_00 = hanabi_learning_env::HanabiHand::Cards(this);
    sVar1 = std::
            vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
            ::size(this_00);
    return (int)sVar1;
  }
  __assert_fail("state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x19d,"int StateGetHandSize(pyhanabi_state_t *, int)");
}

Assistant:

int StateGetHandSize(pyhanabi_state_t* state, int pid) {
  REQUIRE(state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->Hands()
      .at(pid)
      .Cards()
      .size();
}